

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  size_t local_38;
  size_t len;
  mbedtls_mpi *pmStack_28;
  int ret;
  mbedtls_mpi *X_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_28 = X;
  X_local = (mbedtls_mpi *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,2);
  p_local._4_4_ = len._4_4_;
  if (len._4_4_ == 0) {
    p_local._4_4_ = mbedtls_mpi_read_binary(pmStack_28,*(uchar **)end_local,local_38);
    *(size_t *)end_local = local_38 + *(long *)end_local;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_mpi(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_mpi *X)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    ret = mbedtls_mpi_read_binary(X, *p, len);

    *p += len;

    return ret;
}